

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O3

int stmm_insert(stmm_table *table,char *key,char *value)

{
  stmm_table_entry **ppsVar1;
  stmm_hash_func_type p_Var2;
  stmm_compare_func_type p_Var3;
  int iVar4;
  int iVar5;
  stmm_table_entry *psVar6;
  stmm_table_entry **ppsVar7;
  int local_48;
  
  p_Var2 = table->hash;
  iVar5 = (int)key;
  if (p_Var2 == stmm_ptrhash) {
    local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var2 == stmm_numhash) {
    local_48 = -iVar5;
    if (0 < iVar5) {
      local_48 = iVar5;
    }
    local_48 = local_48 % table->num_bins;
  }
  else {
    local_48 = (*p_Var2)(key,table->num_bins);
  }
  psVar6 = table->bins[local_48];
  if (psVar6 != (stmm_table_entry *)0x0) {
    ppsVar7 = table->bins + local_48;
    do {
      p_Var3 = table->compare;
      if (p_Var3 == stmm_numcmp || p_Var3 == stmm_ptrcmp) {
        if (psVar6->key == key) {
LAB_0049a4c7:
          if (table->reorder_flag != 0) {
            *ppsVar7 = psVar6->next;
            ppsVar7 = table->bins;
            psVar6->next = ppsVar7[local_48];
            ppsVar7[local_48] = psVar6;
          }
          psVar6->record = value;
          return 1;
        }
      }
      else {
        iVar4 = (*p_Var3)(key,psVar6->key);
        if (iVar4 == 0) goto LAB_0049a4c7;
      }
      ppsVar1 = &psVar6->next;
      ppsVar7 = &psVar6->next;
      psVar6 = *ppsVar1;
    } while (*ppsVar1 != (stmm_table_entry *)0x0);
  }
  if (table->max_density <= table->num_entries / table->num_bins) {
    iVar4 = rehash(table);
    if (iVar4 == -10000) {
      return -10000;
    }
    p_Var2 = table->hash;
    if (p_Var2 == stmm_ptrhash) {
      local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
    }
    else if (p_Var2 == stmm_numhash) {
      local_48 = -iVar5;
      if (0 < iVar5) {
        local_48 = iVar5;
      }
      local_48 = local_48 % table->num_bins;
    }
    else {
      local_48 = (*p_Var2)(key,table->num_bins);
    }
  }
  psVar6 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
  if (psVar6 == (stmm_table_entry *)0x0) {
    iVar5 = -10000;
  }
  else {
    psVar6->key = key;
    psVar6->record = value;
    ppsVar7 = table->bins;
    psVar6->next = ppsVar7[local_48];
    ppsVar7[local_48] = psVar6;
    table->num_entries = table->num_entries + 1;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
stmm_insert (stmm_table *table, char *key, char *value)
{
    int hash_val;
    stmm_table_entry *newEntry;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    if (table->num_entries / table->num_bins >= table->max_density) {
        if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
        }
        hash_val = do_hash (key, table);
    }

//              newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
        return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = value;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    return 0;
    }
    else {
    ptr->record = value;
    return 1;
    }
}